

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O0

TCGv_i32 do_reduction_op(DisasContext_conflict1 *s,int fpopcode,int rn,int esize,int size,int vmap,
                        TCGv_ptr fpst)

{
  TCGContext_conflict1 *tcg_ctx_00;
  MemOp memop;
  int iVar1;
  uint vmap_00;
  TCGv_i32 arg2;
  TCGv_i32 arg1;
  TCGv_i32 tcg_res;
  TCGv_i32 tcg_lo;
  TCGv_i32 tcg_hi;
  int vmap_hi;
  int vmap_lo;
  int shift;
  int bits;
  TCGv_i32 tcg_elem;
  MemOp msize;
  int element;
  TCGContext_conflict1 *tcg_ctx;
  int vmap_local;
  int size_local;
  int esize_local;
  int rn_local;
  int fpopcode_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  if (esize == size) {
    memop = MO_32;
    if (esize == 0x10) {
      memop = MO_16;
    }
    iVar1 = ctpop8((uint8_t)vmap);
    if (iVar1 != 1) {
      __assert_fail("ctpop8(vmap) == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                    ,0x1cf9,
                    "TCGv_i32 do_reduction_op(DisasContext *, int, int, int, int, int, TCGv_ptr)");
    }
    iVar1 = ctz32(vmap);
    if (7 < iVar1) {
      __assert_fail("element < 8",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                    ,0x1cfb,
                    "TCGv_i32 do_reduction_op(DisasContext *, int, int, int, int, int, TCGv_ptr)");
    }
    s_local = (DisasContext_conflict1 *)tcg_temp_new_i32(tcg_ctx_00);
    read_vec_element_i32(s,(TCGv_i32)s_local,rn,iVar1,memop);
  }
  else {
    iVar1 = ctpop8((uint8_t)vmap);
    vmap_hi._0_1_ = (byte)(iVar1 / 2);
    vmap_00 = vmap >> ((byte)vmap_hi & 0x1f) & vmap;
    arg2 = do_reduction_op(s,fpopcode,rn,esize,size / 2,vmap & ~vmap_00,fpst);
    arg1 = do_reduction_op(s,fpopcode,rn,esize,size / 2,vmap_00,fpst);
    s_local = (DisasContext_conflict1 *)tcg_temp_new_i32(tcg_ctx_00);
    if (0x32 < fpopcode - 0xcU && fpopcode != 0x3f) {
LAB_00843ee0:
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                 ,0x1d25,(char *)0x0);
    }
    switch((long)&switchD_00843df8::switchdataD_0137cfa4 +
           (long)(int)(&switchD_00843df8::switchdataD_0137cfa4)[fpopcode - 0xcU]) {
    case 0x843dfa:
      gen_helper_advsimd_maxnumh(tcg_ctx_00,(TCGv_i32)s_local,arg1,arg2,fpst);
      break;
    case 0x843e18:
      gen_helper_advsimd_maxh(tcg_ctx_00,(TCGv_i32)s_local,arg1,arg2,fpst);
      break;
    case 0x843e36:
      gen_helper_advsimd_minnumh(tcg_ctx_00,(TCGv_i32)s_local,arg1,arg2,fpst);
      break;
    case 0x843e54:
      gen_helper_advsimd_minh(tcg_ctx_00,(TCGv_i32)s_local,arg1,arg2,fpst);
      break;
    case 0x843e72:
      gen_helper_vfp_maxnums(tcg_ctx_00,(TCGv_i32)s_local,arg1,arg2,fpst);
      break;
    case 0x843e8d:
      gen_helper_vfp_maxs(tcg_ctx_00,(TCGv_i32)s_local,arg1,arg2,fpst);
      break;
    case 0x843ea8:
      gen_helper_vfp_minnums(tcg_ctx_00,(TCGv_i32)s_local,arg1,arg2,fpst);
      break;
    case 0x843ec3:
      gen_helper_vfp_mins(tcg_ctx_00,(TCGv_i32)s_local,arg1,arg2,fpst);
      break;
    default:
      goto LAB_00843ee0;
    }
    tcg_temp_free_i32(tcg_ctx_00,arg2);
    tcg_temp_free_i32(tcg_ctx_00,arg1);
  }
  return (TCGv_i32)s_local;
}

Assistant:

static TCGv_i32 do_reduction_op(DisasContext *s, int fpopcode, int rn,
                                int esize, int size, int vmap, TCGv_ptr fpst)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    if (esize == size) {
        int element;
        MemOp msize = esize == 16 ? MO_16 : MO_32;
        TCGv_i32 tcg_elem;

        /* We should have one register left here */
        assert(ctpop8(vmap) == 1);
        element = ctz32(vmap);
        assert(element < 8);

        tcg_elem = tcg_temp_new_i32(tcg_ctx);
        read_vec_element_i32(s, tcg_elem, rn, element, msize);
        return tcg_elem;
    } else {
        int bits = size / 2;
        int shift = ctpop8(vmap) / 2;
        int vmap_lo = (vmap >> shift) & vmap;
        int vmap_hi = (vmap & ~vmap_lo);
        TCGv_i32 tcg_hi, tcg_lo, tcg_res;

        tcg_hi = do_reduction_op(s, fpopcode, rn, esize, bits, vmap_hi, fpst);
        tcg_lo = do_reduction_op(s, fpopcode, rn, esize, bits, vmap_lo, fpst);
        tcg_res = tcg_temp_new_i32(tcg_ctx);

        switch (fpopcode) {
        case 0x0c: /* fmaxnmv half-precision */
            gen_helper_advsimd_maxnumh(tcg_ctx, tcg_res, tcg_lo, tcg_hi, fpst);
            break;
        case 0x0f: /* fmaxv half-precision */
            gen_helper_advsimd_maxh(tcg_ctx, tcg_res, tcg_lo, tcg_hi, fpst);
            break;
        case 0x1c: /* fminnmv half-precision */
            gen_helper_advsimd_minnumh(tcg_ctx, tcg_res, tcg_lo, tcg_hi, fpst);
            break;
        case 0x1f: /* fminv half-precision */
            gen_helper_advsimd_minh(tcg_ctx, tcg_res, tcg_lo, tcg_hi, fpst);
            break;
        case 0x2c: /* fmaxnmv */
            gen_helper_vfp_maxnums(tcg_ctx, tcg_res, tcg_lo, tcg_hi, fpst);
            break;
        case 0x2f: /* fmaxv */
            gen_helper_vfp_maxs(tcg_ctx, tcg_res, tcg_lo, tcg_hi, fpst);
            break;
        case 0x3c: /* fminnmv */
            gen_helper_vfp_minnums(tcg_ctx, tcg_res, tcg_lo, tcg_hi, fpst);
            break;
        case 0x3f: /* fminv */
            gen_helper_vfp_mins(tcg_ctx, tcg_res, tcg_lo, tcg_hi, fpst);
            break;
        default:
            g_assert_not_reached();
        }

        tcg_temp_free_i32(tcg_ctx, tcg_hi);
        tcg_temp_free_i32(tcg_ctx, tcg_lo);
        return tcg_res;
    }
}